

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
proposeMove(GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this,
           size_t v0,size_t v1)

{
  pointer pmVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  key_type *pkVar7;
  EdgeOperation move;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  mapped_type local_40;
  double local_38;
  ulong local_30;
  
  pmVar1 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).vertices_.
           super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = v1;
  local_50 = v0;
  if (*(size_t *)((long)&pmVar1[v0]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
    p_Var5 = *(_Base_ptr *)((long)&pmVar1[v0]._M_t._M_impl.super__Rb_tree_header + 8);
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var2 = &pmVar1[v0]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var6 = p_Var2;
      do {
        if (*(ulong *)(p_Var5 + 1) >= v1) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < v1];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((p_Var6 != p_Var2) && (*(ulong *)(p_Var6 + 1) <= v1)) {
        sVar3 = v1;
        if (v0 < v1) {
          sVar3 = v0;
        }
        pkVar7 = &local_50;
        if (v0 <= v1) {
          pkVar7 = &local_58;
        }
        pmVar4 = std::
                 map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[]((this->editions_).
                              super__Vector_base<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + sVar3,pkVar7);
        *pmVar4 = *pmVar4 + 1;
        DynamicLineage<std::vector<double,_std::allocator<double>_>_>::proposeMove
                  ((EdgeOperation *)&local_50,
                   &this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>,v0,v1)
        ;
        if (local_38 <= 0.0) {
          local_30 = local_48;
          sVar3 = local_48;
          if (local_50 < local_48) {
            sVar3 = local_50;
          }
          local_58 = local_50;
          pkVar7 = &local_58;
          if (local_50 <= local_48) {
            pkVar7 = &local_30;
          }
          pmVar4 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[]((this->editions_).
                                super__Vector_base<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + sVar3,pkVar7);
          local_40 = *pmVar4;
          std::
          priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
          ::push(&this->queue_,(value_type *)&local_50);
        }
        return;
      }
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Cannot increase edition of an edge that does not exist!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void proposeMove(const size_t v0, const size_t v1)
    {
        increaseEdition(v0, v1); // invalidate old moves along (v0, v1)
        auto move = DynamicLineage<EVA>::proposeMove(v0, v1);
        if (move.delta <= .0) {
            move.edition = getEdition(move.v0, move.v1);
            queue_.push(move);
        }
    }